

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

void __thiscall
icu_63::OlsonTimeZone::getOffset
          (OlsonTimeZone *this,UDate date,UBool local,int32_t *rawoff,int32_t *dstoff,UErrorCode *ec
          )

{
  UBool UVar1;
  UErrorCode *ec_local;
  int32_t *dstoff_local;
  int32_t *rawoff_local;
  UBool local_local;
  UDate date_local;
  OlsonTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    if ((this->finalZone == (SimpleTimeZone *)0x0) || (date < this->finalStartMillis)) {
      getHistoricalOffset(this,date,local,4,0xc,rawoff,dstoff);
    }
    else {
      (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[6])
                (date,this->finalZone,(ulong)(uint)(int)local,rawoff,dstoff,ec);
    }
  }
  return;
}

Assistant:

void OlsonTimeZone::getOffset(UDate date, UBool local, int32_t& rawoff,
                              int32_t& dstoff, UErrorCode& ec) const {
    if (U_FAILURE(ec)) {
        return;
    }
    if (finalZone != NULL && date >= finalStartMillis) {
        finalZone->getOffset(date, local, rawoff, dstoff, ec);
    } else {
        getHistoricalOffset(date, local, kFormer, kLatter, rawoff, dstoff);
    }
}